

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O1

Expression * __thiscall
wasm::SafeHeap::makeAlignCheck
          (SafeHeap *this,Address align,Builder *builder,Index local,Module *module,Name memoryName)

{
  uintptr_t uVar1;
  Memory *pMVar2;
  Unary *pUVar3;
  Unary *this_00;
  Const *pCVar4;
  Binary *this_01;
  Call *pCVar5;
  If *this_02;
  ulong uVar6;
  optional<wasm::Type> type_;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  SafeHeap *local_48;
  address64_t local_40;
  UnaryOp local_34;
  
  local_48 = this;
  local_40 = align.addr;
  local_34 = local;
  pMVar2 = Module::getMemory(module,memoryName);
  uVar1 = (pMVar2->addressType).id;
  pUVar3 = (Unary *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = LocalGetId;
  pUVar3->op = local_34;
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = uVar1;
  this_00 = pUVar3;
  if ((pMVar2->addressType).id == 3) {
    this_00 = (Unary *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = WrapInt64;
    this_00->value = (Expression *)pUVar3;
    Unary::finalize(this_00);
  }
  pCVar4 = Builder::makeConst<int>(builder,(int)local_40 + -1);
  this_01 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = AndInt32;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pCVar4;
  Binary::finalize(this_01);
  local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar5 = Builder::makeCall(builder,(Name)(local_48->alignfault).super_IString.str,&local_68,
                             (Type)0x0,false);
  uVar6 = 0x28;
  this_02 = (If *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_02->ifFalse = (Expression *)0x0;
  this_02->condition = (Expression *)this_01;
  this_02->ifTrue = (Expression *)pCVar5;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar6;
  If::finalize(this_02,type_);
  if (local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)this_02;
}

Assistant:

Expression* makeAlignCheck(Address align,
                             Builder& builder,
                             Index local,
                             Module* module,
                             Name memoryName) {
    auto memory = module->getMemory(memoryName);
    auto addressType = memory->addressType;
    Expression* ptrBits = builder.makeLocalGet(local, addressType);
    if (memory->is64()) {
      ptrBits = builder.makeUnary(WrapInt64, ptrBits);
    }
    return builder.makeIf(
      builder.makeBinary(
        AndInt32, ptrBits, builder.makeConst(int32_t(align - 1))),
      builder.makeCall(alignfault, {}, Type::none));
  }